

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O2

char * parse_zone_name(char *dst,size_t dstlen,char *p,size_t *len)

{
  ushort **ppuVar1;
  size_t sVar2;
  
  if (p == (char *)0x0) {
    p = (char *)0x0;
  }
  else {
    sVar2 = *len;
    while (sVar2 != 0) {
      ppuVar1 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar1 + (long)*p * 2 + 1) & 4) == 0) break;
      if (1 < dstlen) {
        *dst = *p;
        dst = dst + 1;
        sVar2 = *len;
      }
      p = p + 1;
      sVar2 = sVar2 - 1;
      *len = sVar2;
    }
  }
  if (dstlen != 0) {
    *dst = '\0';
  }
  return p;
}

Assistant:

static const char *parse_zone_name(char *dst, size_t dstlen,
                                   const char *p, size_t *len)
{
    /* if there's a pointer, scan the string */
    if (p != 0)
    {
        /* skip alphabetics */
        for ( ; *len != 0 && isalpha(*p) ; ++p, --*len)
        {
            /* 
             *   copy to the output if there's room for this character plus a
             *   null terminator 
             */
            if (dstlen > 1)
                *dst++ = *p;
        }
    }

    /* null-terminate the output if there's room */
    if (dstlen > 0)
        *dst = '\0';

    /* return the final pointer */
    return p;
}